

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O3

PsbtGlobalXpubStruct * __thiscall
cfd::api::json::PsbtGlobalXpub::ConvertToStruct
          (PsbtGlobalXpubStruct *__return_storage_ptr__,PsbtGlobalXpub *this)

{
  _Rb_tree_header *p_Var1;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  char local_58 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  PsbtGlobalXpubStruct::PsbtGlobalXpubStruct(__return_storage_ptr__);
  XpubData::ConvertToStruct((XpubDataStruct *)local_88,&this->xpub_);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_88);
  std::__cxx11::string::operator=((string *)&(__return_storage_ptr__->xpub).hex,(string *)&local_68)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->xpub).ignore_items._M_t);
  if (local_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &local_48._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->xpub).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_color = local_48._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->xpub).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->xpub).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->xpub).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_right = local_48._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(__return_storage_ptr__->xpub).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header;
    (__return_storage_ptr__->xpub).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_48._M_impl.super__Rb_tree_header._M_node_count;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_48);
  if (local_68._M_p != local_58) {
    operator_delete(local_68._M_p);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->master_fingerprint);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->path);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->descriptor_xpub);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

PsbtGlobalXpubStruct PsbtGlobalXpub::ConvertToStruct() const {  // NOLINT
  PsbtGlobalXpubStruct result;
  result.xpub = xpub_.ConvertToStruct();
  result.master_fingerprint = master_fingerprint_;
  result.path = path_;
  result.descriptor_xpub = descriptor_xpub_;
  result.ignore_items = ignore_items;
  return result;
}